

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_iterate64
                (run_container_t *cont,uint32_t base,roaring_iterator64 iterator,uint64_t high_bits,
                void *ptr)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  int local_48;
  int j;
  int iStack_3c;
  uint16_t le;
  uint32_t run_start;
  int i;
  void *ptr_local;
  uint64_t high_bits_local;
  roaring_iterator64 iterator_local;
  uint32_t base_local;
  run_container_t *cont_local;
  
  iStack_3c = 0;
  do {
    if (cont->n_runs <= iStack_3c) {
      return true;
    }
    uVar1 = cont->runs[iStack_3c].value;
    uVar2 = cont->runs[iStack_3c].length;
    for (local_48 = 0; local_48 <= (int)(uint)uVar2; local_48 = local_48 + 1) {
      _Var3 = (*iterator)(high_bits | base + uVar1 + local_48,ptr);
      if (!_Var3) {
        return false;
      }
    }
    iStack_3c = iStack_3c + 1;
  } while( true );
}

Assistant:

bool run_container_iterate64(const run_container_t *cont, uint32_t base,
                             roaring_iterator64 iterator, uint64_t high_bits,
                             void *ptr) {
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;

        for (int j = 0; j <= le; ++j)
            if (!iterator(high_bits | (uint64_t)(run_start + j), ptr))
                return false;
    }
    return true;
}